

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

void duckdb::Prefix::ConcatChildIsGate(ART *art,Node *parent,uint8_t byte,Node *child)

{
  Prefix tail;
  uint8_t local_59;
  Prefix local_58;
  Prefix local_38;
  
  local_59 = byte;
  if (((parent->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) {
    GetTail(&local_58,art,parent);
    Append(&local_38,&local_58,art,local_59);
    local_58.ptr = local_38.ptr;
  }
  else {
    NewInternal(&local_58,art,parent,&local_59,'\x01',0,PREFIX);
  }
  ((local_58.ptr)->super_IndexPointer).data = (child->super_IndexPointer).data;
  return;
}

Assistant:

void Prefix::ConcatChildIsGate(ART &art, Node &parent, uint8_t byte, const Node &child) {
	// Create a new prefix and point it to the gate.
	if (parent.GetType() != PREFIX) {
		auto prefix = NewInternal(art, parent, &byte, 1, 0, PREFIX);
		*prefix.ptr = child;
		return;
	}

	auto tail = GetTail(art, parent);
	tail = tail.Append(art, byte);
	*tail.ptr = child;
}